

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cpp
# Opt level: O2

string * sqlcheck::WrapText(string *__return_storage_ptr__,string *text)

{
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  ulong uVar4;
  bool bVar5;
  string word;
  ostringstream wrapped;
  istringstream words;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&words,(string *)text,_S_in);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&wrapped);
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  piVar2 = std::operator>>((istream *)&words,(string *)&word);
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
    std::operator<<((ostream *)&wrapped,(string *)&word);
    uVar4 = 0x50 - word._M_string_length;
    bVar5 = false;
    while( true ) {
      piVar2 = std::operator>>((istream *)&words,(string *)&word);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      bVar1 = std::operator==(&word,anon_var_dwarf_61c47);
      if (bVar1) {
        std::operator<<((ostream *)&wrapped,"\n\n");
      }
      if ((bool)(~bVar5 & word._M_string_length + 1 <= uVar4)) {
        poVar3 = (ostream *)&wrapped;
        if (!bVar1) {
          poVar3 = std::operator<<((ostream *)&wrapped,' ');
        }
        std::operator<<(poVar3,(string *)&word);
        uVar4 = uVar4 + ~word._M_string_length;
      }
      else {
        poVar3 = std::operator<<((ostream *)&wrapped,'\n');
        std::operator<<(poVar3,(string *)&word);
        uVar4 = 0x50 - word._M_string_length;
      }
      bVar5 = word._M_dataplus._M_p[word._M_string_length - 1] == ':';
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&word);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&wrapped);
  std::__cxx11::istringstream::~istringstream((istringstream *)&words);
  return __return_storage_ptr__;
}

Assistant:

std::string WrapText(const std::string& text){

  size_t line_length = 80;

  std::istringstream words(text);
  std::ostringstream wrapped;
  std::string word;
  bool newline = false;
  bool newpara = false;

  if (words >> word) {

    wrapped << word;

    size_t space_left = line_length - word.length();
    while (words >> word) {
      if(word == "●"){
        wrapped << "\n\n";
        newpara = true;
      }
      else{
        newpara = false;
      }

      if (space_left < word.length() + 1 || newline) {
        wrapped << '\n' << word;
        space_left = line_length - word.length();
      }
      else {
        if(newpara == false){
          wrapped << ' ' << word;
        }
        else{
          wrapped << word;
        }
        space_left -= word.length() + 1;
      }

      if(word.back() == ':'){
        newline = true;
      }
      else{
        newline = false;
      }
    }

  }

  return wrapped.str();
}